

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

int poptSaveString(char ***argvp,uint argInfo,char *val)

{
  uint uVar1;
  char **ppcVar2;
  size_t sVar3;
  char *pcVar4;
  char **ppcVar5;
  ulong uVar6;
  
  if (val == (char *)0x0 || argvp == (char ***)0x0) {
    return -0x14;
  }
  ppcVar2 = *argvp;
  if (ppcVar2 == (char **)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0xffffffff;
    ppcVar5 = ppcVar2;
    do {
      uVar1 = uVar1 + 1;
      pcVar4 = *ppcVar5;
      ppcVar5 = ppcVar5 + 1;
    } while (pcVar4 != (char *)0x0);
  }
  uVar6 = (ulong)uVar1;
  ppcVar2 = (char **)realloc(ppcVar2,uVar6 * 8 + 0x10);
  if (ppcVar2 != (char **)0x0) {
    *argvp = ppcVar2;
    sVar3 = strlen(val);
    pcVar4 = (char *)malloc(sVar3 + 1);
    if (pcVar4 != (char *)0x0) {
      strcpy(pcVar4,val);
      ppcVar2[uVar6] = pcVar4;
      ppcVar2[uVar6 + 1] = (char *)0x0;
      return 0;
    }
  }
  fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
  exit(1);
}

Assistant:

int poptSaveString(const char *** argvp,
		UNUSED(unsigned int argInfo), const char * val)
{
    int argc = 0;

    if (argvp == NULL || val == NULL)
	return POPT_ERROR_NULLARG;

    /* XXX likely needs an upper bound on argc. */
    if (*argvp != NULL)
    while ((*argvp)[argc] != NULL)
	argc++;
 
    if ((*argvp = xrealloc(*argvp, (argc + 1 + 1) * sizeof(**argvp))) != NULL) {
	(*argvp)[argc++] = xstrdup(val);
	(*argvp)[argc  ] = NULL;
    }
    return 0;
}